

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O1

string * FormatParagraph_abi_cxx11_
                   (string *__return_storage_ptr__,string_view in,size_t width,size_t indent)

{
  bool bVar1;
  char *pcVar2;
  void *pvVar3;
  size_t sVar4;
  size_type sVar5;
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  ulong __pos;
  size_t sVar9;
  long in_FS_OFFSET;
  stringstream out;
  basic_string_view<char,_std::char_traits<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  stringstream local_1c0 [16];
  ostream local_1b0 [112];
  ios_base local_140 [264];
  long local_38;
  
  local_1f0._M_str = in._M_str;
  local_1f0._M_len = in._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (width < indent) {
LAB_00771dbf:
    __assert_fail("width >= indent",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/strencodings.cpp"
                  ,0x100,"std::string FormatParagraph(std::string_view, size_t, size_t)");
  }
  std::__cxx11::stringstream::stringstream(local_1c0);
  sVar9 = 0;
  __pos = 0;
  do {
    pcVar2 = local_1f0._M_str;
    sVar4 = local_1f0._M_len;
    if (local_1f0._M_len < __pos || local_1f0._M_len - __pos == 0) break;
    pvVar3 = memchr(local_1f0._M_str + __pos,10,local_1f0._M_len - __pos);
    uVar8 = -(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)pcVar2;
    if (uVar8 == 0xffffffffffffffff) {
      uVar8 = sVar4;
    }
    if (uVar8 - __pos <= width - sVar9) {
      if (__pos <= sVar4) {
        uVar7 = (uVar8 - __pos) + 1;
        if (sVar4 - __pos < uVar7) {
          uVar7 = sVar4 - __pos;
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1b0,local_1f0._M_str + __pos,uVar7)
        ;
        __pos = uVar8 + 1;
        bVar1 = true;
        sVar9 = 0;
        goto LAB_00771cd5;
      }
LAB_00771d8d:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00771e5c;
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 __pos,sVar4);
      goto LAB_00771dbf;
    }
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                      (&local_1f0," \n",(width - sVar9) + __pos,2);
    sVar5 = sVar4;
    if ((sVar4 == 0xffffffffffffffff || sVar4 < __pos) &&
       (sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                          (&local_1f0,"\n ",__pos,2), sVar5 == 0xffffffffffffffff)) {
      if (local_1f0._M_len < __pos) {
LAB_00771d5e:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     __pos);
          goto LAB_00771d8d;
        }
        goto LAB_00771e5c;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1b0,local_1f0._M_str + __pos,local_1f0._M_len - __pos);
      bVar1 = false;
    }
    else {
      sVar4 = sVar5;
      if (local_1f0._M_len < __pos) goto LAB_00771d5e;
      uVar8 = sVar5 - __pos;
      if (local_1f0._M_len - __pos < sVar5 - __pos) {
        uVar8 = local_1f0._M_len - __pos;
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1b0,local_1f0._M_str + __pos,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if (local_1f0._M_str[sVar5] == '\n') {
        sVar9 = 0;
      }
      if (local_1f0._M_str[sVar5] != '\n' && indent != 0) {
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct(&local_1e0,indent,' ');
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1b0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
        sVar9 = indent;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
      }
      __pos = sVar5 + 1;
      bVar1 = true;
    }
LAB_00771cd5:
  } while (bVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  std::ios_base::~ios_base(local_140);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00771e5c:
  __stack_chk_fail();
}

Assistant:

std::string FormatParagraph(std::string_view in, size_t width, size_t indent)
{
    assert(width >= indent);
    std::stringstream out;
    size_t ptr = 0;
    size_t indented = 0;
    while (ptr < in.size())
    {
        size_t lineend = in.find_first_of('\n', ptr);
        if (lineend == std::string::npos) {
            lineend = in.size();
        }
        const size_t linelen = lineend - ptr;
        const size_t rem_width = width - indented;
        if (linelen <= rem_width) {
            out << in.substr(ptr, linelen + 1);
            ptr = lineend + 1;
            indented = 0;
        } else {
            size_t finalspace = in.find_last_of(" \n", ptr + rem_width);
            if (finalspace == std::string::npos || finalspace < ptr) {
                // No place to break; just include the entire word and move on
                finalspace = in.find_first_of("\n ", ptr);
                if (finalspace == std::string::npos) {
                    // End of the string, just add it and break
                    out << in.substr(ptr);
                    break;
                }
            }
            out << in.substr(ptr, finalspace - ptr) << "\n";
            if (in[finalspace] == '\n') {
                indented = 0;
            } else if (indent) {
                out << std::string(indent, ' ');
                indented = indent;
            }
            ptr = finalspace + 1;
        }
    }
    return out.str();
}